

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vod_common.cpp
# Opt level: O2

string * toNativeSeparators(string *__return_storage_ptr__,string *dirName)

{
  pointer pcVar1;
  size_type sVar2;
  char cVar3;
  string *__range1;
  size_type sVar4;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)dirName);
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  sVar2 = __return_storage_ptr__->_M_string_length;
  for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
    cVar3 = pcVar1[sVar4];
    if ((cVar3 == '\\') || (cVar3 == '/')) {
      cVar3 = getDirSeparator();
      pcVar1[sVar4] = cVar3;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toNativeSeparators(const std::string& dirName)
{
    std::string rez = dirName;
    for (char& c : rez)
    {
        if (c == '\\' || c == '/')
            c = getDirSeparator();
    }
    return rez;
}